

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_spgmr_serial.c
# Opt level: O1

int main(int argc,char **argv)

{
  N_Vector v_vec;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint onoff;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  N_Vector p_Var13;
  long lVar14;
  SUNLinearSolver p_Var15;
  char *__s;
  long lVar16;
  double tol;
  UserData ProbData;
  SUNContext sunctx;
  long local_80;
  long local_78;
  N_Vector local_70;
  N_Vector local_68;
  long local_60;
  undefined8 local_58;
  N_Vector local_50;
  SUNLinearSolver local_48;
  ulong local_40;
  N_Vector local_38;
  
  iVar1 = SUNContext_Create(0,&local_58);
  if (iVar1 != 0) {
    puts("ERROR: SUNContext_Create failed");
    return -1;
  }
  if (argc < 7) {
    puts("ERROR: SIX (6) Inputs required:");
    puts("  Problem size should be >0");
    puts("  Gram-Schmidt orthogonalization type should be 1 or 2");
    puts("  Preconditioning type should be 1 or 2");
    puts("  Maximum Krylov subspace dimension should be >0");
    puts("  Solver tolerance should be >0");
    __s = "  timing output flag should be 0 or 1 ";
  }
  else {
    problem_size = atol(argv[1]);
    local_80 = problem_size;
    if (problem_size < 1) {
      __s = "ERROR: Problem size must be a positive integer";
    }
    else {
      uVar2 = atoi(argv[2]);
      if (uVar2 - 3 < 0xfffffffe) {
        __s = "ERROR: Gram-Schmidt orthogonalization type must be either 1 or 2";
      }
      else {
        uVar3 = atoi(argv[3]);
        if (uVar3 - 3 < 0xfffffffe) {
          __s = "ERROR: Preconditioning type must be either 1 or 2";
        }
        else {
          uVar4 = atoi(argv[4]);
          if ((int)uVar4 < 1) {
            __s = "ERROR: Maximum Krylov subspace dimension must be a positive integer";
          }
          else {
            tol = atof(argv[5]);
            if (0.0 < tol) {
              onoff = atoi(argv[6]);
              SetTiming(onoff);
              puts("\nSPGMR linear solver test:");
              printf("  Problem size = %ld\n",local_80);
              printf("  Gram-Schmidt orthogonalization type = %i\n",(ulong)uVar2);
              local_40 = (ulong)uVar3;
              printf("  Preconditioning type = %i\n",(ulong)uVar3);
              printf("  Maximum Krylov subspace dimension = %i\n",(ulong)uVar4);
              printf("  Solver Tolerance = %g\n",tol);
              printf("  timing output flag = %i\n\n",(ulong)onoff);
              p_Var13 = (N_Vector)N_VNew_Serial(local_80,local_58);
              if (p_Var13 == (N_Vector)0x0) {
                main_cold_6();
                return 1;
              }
              local_60 = N_VNew_Serial(local_80,local_58);
              if (local_60 == 0) {
                main_cold_5();
                return 1;
              }
              local_50 = (N_Vector)N_VNew_Serial(local_80,local_58);
              if (local_50 == (N_Vector)0x0) {
                main_cold_4();
                return 1;
              }
              local_78 = N_VNew_Serial(local_80,local_58);
              if (local_78 != 0) {
                local_70 = (N_Vector)N_VNew_Serial(local_80,local_58);
                if (local_70 == (N_Vector)0x0) {
                  main_cold_2();
                  return 1;
                }
                local_68 = (N_Vector)N_VNew_Serial(local_80,local_58);
                if (local_68 != (N_Vector)0x0) {
                  lVar14 = N_VGetArrayPointer(local_60);
                  if (0 < local_80) {
                    lVar16 = 0;
                    do {
                      iVar1 = rand();
                      *(double *)(lVar14 + lVar16 * 8) = (double)iVar1 / 2147483647.0 + 1.0;
                      lVar16 = lVar16 + 1;
                    } while (lVar16 < local_80);
                  }
                  N_VConst(0x4014000000000000,local_78);
                  p_Var15 = (SUNLinearSolver)SUNLinSol_SPGMR(p_Var13,local_40,uVar4);
                  iVar1 = Test_SUNLinSolGetType(p_Var15,SUNLINEARSOLVER_ITERATIVE,0);
                  iVar5 = Test_SUNLinSolGetID(p_Var15,SUNLINEARSOLVER_SPGMR,0);
                  iVar6 = Test_SUNLinSolSetATimes(p_Var15,&local_80,ATimes,0);
                  local_38 = p_Var13;
                  iVar7 = Test_SUNLinSolSetPreconditioner(p_Var15,&local_80,PSetup,PSolve,0);
                  iVar8 = Test_SUNLinSolSetScalingVectors(p_Var15,local_70,local_68,0);
                  iVar9 = Test_SUNLinSolSetZeroGuess(p_Var15,0);
                  iVar10 = Test_SUNLinSolInitialize(p_Var15,0);
                  iVar11 = Test_SUNLinSolSpace(p_Var15,0);
                  iVar12 = SUNLinSol_SPGMRSetGSType(p_Var15,uVar2);
                  uVar2 = iVar12 + iVar11 + iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar1;
                  if (uVar2 == 0) {
                    puts("SUCCESS: SUNLinSol_SPGMR module passed all initialization tests\n");
                    N_VConst(0x3ff0000000000000,local_70);
                    N_VConst(0x3ff0000000000000,local_68);
                    v_vec = local_38;
                    N_VDiv(local_60,local_68,local_38);
                    p_Var13 = local_50;
                    uVar2 = ATimes(&local_80,v_vec,local_50);
                    if (uVar2 != 0) {
                      fprintf(_stderr,"\nERROR: %s() failed with flag = %d\n\n","ATimes",
                              (ulong)uVar2);
                      return 1;
                    }
                    iVar1 = SUNLinSol_SPGMRSetPrecType(p_Var15);
                    iVar5 = Test_SUNLinSolSetup(p_Var15,(SUNMatrix)0x0,0);
                    iVar6 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,v_vec,p_Var13,tol,1,0);
                    iVar7 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,v_vec,p_Var13,tol,0,0);
                    iVar8 = Test_SUNLinSolLastFlag(p_Var15,0);
                    iVar9 = Test_SUNLinSolNumIters(p_Var15,0);
                    iVar10 = Test_SUNLinSolResNorm(p_Var15,0);
                    local_48 = p_Var15;
                    iVar11 = Test_SUNLinSolResid(p_Var15,0);
                    uVar2 = iVar11 + iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar1;
                    if (uVar2 == 0) {
                      puts("SUCCESS: SUNLinSol_SPGMR module, problem 1, passed all tests\n");
                    }
                    else {
                      printf("FAIL: SUNLinSol_SPGMR module, problem 1, failed %i tests\n\n",
                             (ulong)uVar2);
                    }
                    uVar3 = (uint)(uVar2 != 0);
                    N_VConst(0x3ff0000000000000,local_70);
                    N_VConst(0x3ff0000000000000,local_68);
                    N_VDiv(local_60,local_68,v_vec);
                    p_Var13 = local_50;
                    uVar2 = ATimes(&local_80,v_vec,local_50);
                    p_Var15 = local_48;
                    if (uVar2 == 0) {
                      iVar1 = SUNLinSol_SPGMRSetPrecType(local_48);
                      iVar5 = Test_SUNLinSolSetup(p_Var15,(SUNMatrix)0x0,0);
                      iVar6 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,v_vec,p_Var13,tol,1,0);
                      iVar7 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,v_vec,p_Var13,tol,0,0);
                      iVar8 = Test_SUNLinSolLastFlag(p_Var15,0);
                      iVar9 = Test_SUNLinSolNumIters(p_Var15,0);
                      iVar10 = Test_SUNLinSolResNorm(p_Var15,0);
                      iVar11 = Test_SUNLinSolResid(p_Var15,0);
                      uVar2 = iVar11 + iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar1;
                      if (uVar2 == 0) {
                        puts("SUCCESS: SUNLinSol_SPGMR module, problem 2, passed all tests\n");
                      }
                      else {
                        printf("FAIL: SUNLinSol_SPGMR module, problem 2, failed %i tests\n\n",
                               (ulong)uVar2);
                        uVar3 = uVar3 + 1;
                      }
                      lVar14 = N_VGetArrayPointer(local_70);
                      p_Var13 = local_50;
                      if (0 < local_80) {
                        lVar16 = 0;
                        do {
                          iVar1 = rand();
                          *(double *)(lVar14 + lVar16 * 8) =
                               ((double)iVar1 / 2147483647.0) * 1000.0 + 1.0;
                          lVar16 = lVar16 + 1;
                        } while (lVar16 < local_80);
                      }
                      N_VConst(0x3ff0000000000000,local_68);
                      N_VDiv(local_60,local_68,v_vec);
                      uVar2 = ATimes(&local_80,v_vec,p_Var13);
                      p_Var15 = local_48;
                      if (uVar2 == 0) {
                        iVar1 = SUNLinSol_SPGMRSetPrecType(local_48);
                        iVar5 = Test_SUNLinSolSetup(p_Var15,(SUNMatrix)0x0,0);
                        iVar6 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,v_vec,p_Var13,tol,1,0);
                        iVar7 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,v_vec,p_Var13,tol,0,0);
                        iVar8 = Test_SUNLinSolLastFlag(p_Var15,0);
                        iVar9 = Test_SUNLinSolNumIters(p_Var15,0);
                        iVar10 = Test_SUNLinSolResNorm(p_Var15,0);
                        iVar11 = Test_SUNLinSolResid(p_Var15,0);
                        uVar2 = iVar11 + iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar1;
                        if (uVar2 == 0) {
                          puts("SUCCESS: SUNLinSol_SPGMR module, problem 3, passed all tests\n");
                        }
                        else {
                          printf("FAIL: SUNLinSol_SPGMR module, problem 3, failed %i tests\n\n",
                                 (ulong)uVar2);
                          uVar3 = uVar3 + 1;
                        }
                        lVar14 = N_VGetArrayPointer(local_70);
                        p_Var13 = local_50;
                        if (0 < local_80) {
                          lVar16 = 0;
                          do {
                            iVar1 = rand();
                            *(double *)(lVar14 + lVar16 * 8) =
                                 ((double)iVar1 / 2147483647.0) * 1000.0 + 1.0;
                            lVar16 = lVar16 + 1;
                          } while (lVar16 < local_80);
                        }
                        N_VConst(0x3ff0000000000000,local_68);
                        N_VDiv(local_60,local_68,v_vec);
                        uVar2 = ATimes(&local_80,v_vec,p_Var13);
                        p_Var15 = local_48;
                        if (uVar2 == 0) {
                          iVar1 = SUNLinSol_SPGMRSetPrecType(local_48);
                          iVar5 = Test_SUNLinSolSetup(p_Var15,(SUNMatrix)0x0,0);
                          iVar6 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,v_vec,p_Var13,tol,1,0);
                          iVar7 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,v_vec,p_Var13,tol,0,0);
                          iVar8 = Test_SUNLinSolLastFlag(p_Var15,0);
                          iVar9 = Test_SUNLinSolNumIters(p_Var15,0);
                          iVar10 = Test_SUNLinSolResNorm(p_Var15,0);
                          iVar11 = Test_SUNLinSolResid(p_Var15,0);
                          uVar2 = iVar11 + iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar1;
                          if (uVar2 == 0) {
                            puts("SUCCESS: SUNLinSol_SPGMR module, problem 4, passed all tests\n");
                          }
                          else {
                            printf("FAIL: SUNLinSol_SPGMR module, problem 4, failed %i tests\n\n",
                                   (ulong)uVar2);
                            uVar3 = uVar3 + 1;
                          }
                          N_VConst(0x3ff0000000000000,local_70);
                          lVar14 = N_VGetArrayPointer(local_68);
                          p_Var13 = local_50;
                          if (0 < local_80) {
                            lVar16 = 0;
                            do {
                              iVar1 = rand();
                              *(double *)(lVar14 + lVar16 * 8) =
                                   ((double)iVar1 / 2147483647.0) * 1000.0 + 1.0;
                              lVar16 = lVar16 + 1;
                            } while (lVar16 < local_80);
                          }
                          N_VDiv(local_60,local_68,v_vec);
                          uVar2 = ATimes(&local_80,v_vec,p_Var13);
                          p_Var15 = local_48;
                          if (uVar2 == 0) {
                            iVar1 = SUNLinSol_SPGMRSetPrecType(local_48);
                            iVar5 = Test_SUNLinSolSetup(p_Var15,(SUNMatrix)0x0,0);
                            iVar6 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,v_vec,p_Var13,tol,1,0
                                                       );
                            iVar7 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,v_vec,p_Var13,tol,0,0
                                                       );
                            iVar8 = Test_SUNLinSolLastFlag(p_Var15,0);
                            iVar9 = Test_SUNLinSolNumIters(p_Var15,0);
                            iVar10 = Test_SUNLinSolResNorm(p_Var15,0);
                            iVar11 = Test_SUNLinSolResid(p_Var15,0);
                            uVar2 = iVar11 + iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar1;
                            if (uVar2 == 0) {
                              puts("SUCCESS: SUNLinSol_SPGMR module, problem 5, passed all tests\n")
                              ;
                            }
                            else {
                              printf("FAIL: SUNLinSol_SPGMR module, problem 5, failed %i tests\n\n",
                                     (ulong)uVar2);
                              uVar3 = uVar3 + 1;
                            }
                            N_VConst(0x3ff0000000000000,local_70);
                            lVar14 = N_VGetArrayPointer(local_68);
                            p_Var13 = local_50;
                            if (0 < local_80) {
                              lVar16 = 0;
                              do {
                                iVar1 = rand();
                                *(double *)(lVar14 + lVar16 * 8) =
                                     ((double)iVar1 / 2147483647.0) * 1000.0 + 1.0;
                                lVar16 = lVar16 + 1;
                              } while (lVar16 < local_80);
                            }
                            N_VDiv(local_60,local_68,v_vec);
                            uVar2 = ATimes(&local_80,v_vec,p_Var13);
                            p_Var15 = local_48;
                            if (uVar2 == 0) {
                              iVar1 = SUNLinSol_SPGMRSetPrecType(local_48);
                              iVar5 = Test_SUNLinSolSetup(p_Var15,(SUNMatrix)0x0,0);
                              iVar6 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,v_vec,p_Var13,tol,1
                                                          ,0);
                              iVar7 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,v_vec,p_Var13,tol,0
                                                          ,0);
                              iVar8 = Test_SUNLinSolLastFlag(p_Var15,0);
                              iVar9 = Test_SUNLinSolNumIters(p_Var15,0);
                              iVar10 = Test_SUNLinSolResNorm(p_Var15,0);
                              iVar11 = Test_SUNLinSolResid(p_Var15,0);
                              uVar2 = iVar11 + iVar10 + iVar9 + iVar8 +
                                               iVar7 + iVar6 + iVar5 + iVar1;
                              if (uVar2 == 0) {
                                puts(
                                    "SUCCESS: SUNLinSol_SPGMR module, problem 6, passed all tests\n"
                                    );
                              }
                              else {
                                printf("FAIL: SUNLinSol_SPGMR module, problem 6, failed %i tests\n\n"
                                       ,(ulong)uVar2);
                                uVar3 = uVar3 + 1;
                              }
                              SUNLinSolFree(p_Var15);
                              N_VDestroy(v_vec);
                              N_VDestroy(local_60);
                              N_VDestroy(local_50);
                              N_VDestroy(local_78);
                              N_VDestroy(local_70);
                              N_VDestroy(local_68);
                              SUNContext_Free(&local_58);
                              return uVar3;
                            }
                          }
                        }
                      }
                    }
                    fprintf(_stderr,"\nERROR: %s() failed with flag = %d\n\n","ATimes",(ulong)uVar2)
                    ;
                    return 1;
                  }
                  printf("FAIL: SUNLinSol_SPGMR module failed %i initialization tests\n\n",
                         (ulong)uVar2);
                  return 1;
                }
                main_cold_1();
                return 1;
              }
              main_cold_3();
              return 1;
            }
            __s = "ERROR: Solver tolerance must be a positive real number";
          }
        }
      }
    }
  }
  puts(__s);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  int fails    = 0;    /* counter for test failures */
  int passfail = 0;    /* overall pass/fail flag    */
  SUNLinearSolver LS;  /* linear solver object      */
  N_Vector xhat, x, b; /* test vectors              */
  UserData ProbData;   /* problem data structure    */
  int gstype, pretype, maxl, print_timing;
  sunindextype i;
  sunrealtype* vecdata;
  double tol;
  SUNContext sunctx;

  if (SUNContext_Create(SUN_COMM_NULL, &sunctx))
  {
    printf("ERROR: SUNContext_Create failed\n");
    return (-1);
  }

  /* check inputs: local problem size, timing flag */
  if (argc < 7)
  {
    printf("ERROR: SIX (6) Inputs required:\n");
    printf("  Problem size should be >0\n");
    printf("  Gram-Schmidt orthogonalization type should be 1 or 2\n");
    printf("  Preconditioning type should be 1 or 2\n");
    printf("  Maximum Krylov subspace dimension should be >0\n");
    printf("  Solver tolerance should be >0\n");
    printf("  timing output flag should be 0 or 1 \n");
    return 1;
  }
  ProbData.N   = (sunindextype)atol(argv[1]);
  problem_size = ProbData.N;
  if (ProbData.N <= 0)
  {
    printf("ERROR: Problem size must be a positive integer\n");
    return 1;
  }
  gstype = atoi(argv[2]);
  if ((gstype < 1) || (gstype > 2))
  {
    printf(
      "ERROR: Gram-Schmidt orthogonalization type must be either 1 or 2\n");
    return 1;
  }
  pretype = atoi(argv[3]);
  if ((pretype < 1) || (pretype > 2))
  {
    printf("ERROR: Preconditioning type must be either 1 or 2\n");
    return 1;
  }
  maxl = atoi(argv[4]);
  if (maxl <= 0)
  {
    printf(
      "ERROR: Maximum Krylov subspace dimension must be a positive integer\n");
    return 1;
  }
  tol = atof(argv[5]);
  if (tol <= ZERO)
  {
    printf("ERROR: Solver tolerance must be a positive real number\n");
    return 1;
  }
  print_timing = atoi(argv[6]);
  SetTiming(print_timing);

  printf("\nSPGMR linear solver test:\n");
  printf("  Problem size = %ld\n", (long int)ProbData.N);
  printf("  Gram-Schmidt orthogonalization type = %i\n", gstype);
  printf("  Preconditioning type = %i\n", pretype);
  printf("  Maximum Krylov subspace dimension = %i\n", maxl);
  printf("  Solver Tolerance = %g\n", tol);
  printf("  timing output flag = %i\n\n", print_timing);

  /* Create vectors */
  x = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(x, "N_VNew_Serial", 0)) { return 1; }
  xhat = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(xhat, "N_VNew_Serial", 0)) { return 1; }
  b = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(b, "N_VNew_Serial", 0)) { return 1; }
  ProbData.d = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.d, "N_VNew_Serial", 0)) { return 1; }
  ProbData.s1 = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.s1, "N_VNew_Serial", 0)) { return 1; }
  ProbData.s2 = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.s2, "N_VNew_Serial", 0)) { return 1; }

  /* Fill xhat vector with uniform random data in [1,2] */
  vecdata = N_VGetArrayPointer(xhat);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + urand(); }

  /* Fill Jacobi vector with matrix diagonal */
  N_VConst(FIVE, ProbData.d);

  /* Create SPGMR linear solver */
  LS = SUNLinSol_SPGMR(x, pretype, maxl, sunctx);
  fails += Test_SUNLinSolGetType(LS, SUNLINEARSOLVER_ITERATIVE, 0);
  fails += Test_SUNLinSolGetID(LS, SUNLINEARSOLVER_SPGMR, 0);
  fails += Test_SUNLinSolSetATimes(LS, &ProbData, ATimes, 0);
  fails += Test_SUNLinSolSetPreconditioner(LS, &ProbData, PSetup, PSolve, 0);
  fails += Test_SUNLinSolSetScalingVectors(LS, ProbData.s1, ProbData.s2, 0);
  fails += Test_SUNLinSolSetZeroGuess(LS, 0);
  fails += Test_SUNLinSolInitialize(LS, 0);
  fails += Test_SUNLinSolSpace(LS, 0);
  fails += SUNLinSol_SPGMRSetGSType(LS, gstype);
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module failed %i initialization tests\n\n",
           fails);
    return 1;
  }
  else
  {
    printf(
      "SUCCESS: SUNLinSol_SPGMR module passed all initialization tests\n\n");
  }

  /*** Test 1: simple Poisson-like solve (no preconditioning) ***/

  /* set scaling vectors */
  N_VConst(ONE, ProbData.s1);
  N_VConst(ONE, ProbData.s2);

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPGMRSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module, problem 1, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPGMR module, problem 1, passed all tests\n\n");
  }

  /*** Test 2: simple Poisson-like solve (Jacobi preconditioning) ***/

  /* set scaling vectors */
  N_VConst(ONE, ProbData.s1);
  N_VConst(ONE, ProbData.s2);

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPGMRSetPrecType(LS, pretype);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module, problem 2, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPGMR module, problem 2, passed all tests\n\n");
  }

  /*** Test 3: Poisson-like solve w/ scaled rows (no preconditioning) ***/

  /* set scaling vectors */
  vecdata = N_VGetArrayPointer(ProbData.s1);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }
  N_VConst(ONE, ProbData.s2);

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPGMRSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module, problem 3, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPGMR module, problem 3, passed all tests\n\n");
  }

  /*** Test 4: Poisson-like solve w/ scaled rows (Jacobi preconditioning) ***/

  /* set scaling vectors */
  vecdata = N_VGetArrayPointer(ProbData.s1);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }
  N_VConst(ONE, ProbData.s2);

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPGMRSetPrecType(LS, pretype);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module, problem 4, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPGMR module, problem 4, passed all tests\n\n");
  }

  /*** Test 5: Poisson-like solve w/ scaled columns (no preconditioning) ***/

  /* set scaling vectors */
  N_VConst(ONE, ProbData.s1);
  vecdata = N_VGetArrayPointer(ProbData.s2);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPGMRSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module, problem 5, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPGMR module, problem 5, passed all tests\n\n");
  }

  /*** Test 6: Poisson-like solve w/ scaled columns (Jacobi preconditioning) ***/

  /* set scaling vector, Jacobi solver vector */
  N_VConst(ONE, ProbData.s1);
  vecdata = N_VGetArrayPointer(ProbData.s2);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPGMRSetPrecType(LS, pretype);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module, problem 6, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPGMR module, problem 6, passed all tests\n\n");
  }

  /* Free solver and vectors */
  SUNLinSolFree(LS);
  N_VDestroy(x);
  N_VDestroy(xhat);
  N_VDestroy(b);
  N_VDestroy(ProbData.d);
  N_VDestroy(ProbData.s1);
  N_VDestroy(ProbData.s2);
  SUNContext_Free(&sunctx);

  return (passfail);
}